

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
fasttext::Model::predict
          (Model *this,vector<int,_std::allocator<int>_> *input,int32_t k,real threshold,
          Predictions *heap,State *state)

{
  element_type *peVar1;
  element_type *peVar2;
  invalid_argument *this_00;
  int64_t iVar3;
  
  if (k == -1) {
    iVar3 = Matrix::size((this->wo_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    k = (int32_t)iVar3;
  }
  else if (k < 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"k needs to be 1 or higher!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
            (heap,(long)(int)(k + 1));
  peVar1 = (this->wi_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Matrix[6])(peVar1,&state->hidden,input);
  peVar2 = (this->loss_).super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Loss[4])(threshold,peVar2,(ulong)(uint)k,heap,state);
  return;
}

Assistant:

void Model::predict(
    const std::vector<int32_t>& input,
    int32_t k,
    real threshold,
    Predictions& heap,
    State& state) const {
  if (k == Model::kUnlimitedPredictions) {
    k = wo_->size(0); // output size
  } else if (k <= 0) {
    throw std::invalid_argument("k needs to be 1 or higher!");
  }
  heap.reserve(k + 1);
  computeHidden(input, state);

  loss_->predict(k, threshold, heap, state);
}